

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void av1_free_ref_frame_buffers(BufferPool *pool)

{
  long in_RDI;
  int i;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < (int)(uint)*(byte *)(in_RDI + 0x48); iVar1 = iVar1 + 1) {
    if ((0 < *(int *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0)) &&
       (*(long *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0 + 0x4c8) != 0)) {
      (**(code **)(in_RDI + 0x38))
                (*(undefined8 *)(in_RDI + 0x28),
                 *(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0 + 0x4c8);
      *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0 + 0x4c8) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0 + 0x4d0) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0 + 0x4d8) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0) = 0;
    }
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0 + 0x48) = 0;
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 0x58e0 + 0x50) = 0;
    aom_free_frame_buffer(in_stack_ffffffffffffffe8);
  }
  aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined1 *)(in_RDI + 0x48) = 0;
  return;
}

Assistant:

void av1_free_ref_frame_buffers(BufferPool *pool) {
  int i;

  for (i = 0; i < pool->num_frame_bufs; ++i) {
    if (pool->frame_bufs[i].ref_count > 0 &&
        pool->frame_bufs[i].raw_frame_buffer.data != NULL) {
      pool->release_fb_cb(pool->cb_priv, &pool->frame_bufs[i].raw_frame_buffer);
      pool->frame_bufs[i].raw_frame_buffer.data = NULL;
      pool->frame_bufs[i].raw_frame_buffer.size = 0;
      pool->frame_bufs[i].raw_frame_buffer.priv = NULL;
      pool->frame_bufs[i].ref_count = 0;
    }
    aom_free(pool->frame_bufs[i].mvs);
    pool->frame_bufs[i].mvs = NULL;
    aom_free(pool->frame_bufs[i].seg_map);
    pool->frame_bufs[i].seg_map = NULL;
    aom_free_frame_buffer(&pool->frame_bufs[i].buf);
  }
  aom_free(pool->frame_bufs);
  pool->frame_bufs = NULL;
  pool->num_frame_bufs = 0;
}